

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O3

void Gem_FuncExpand(Gem_Man_t *p,int f,int i)

{
  int iVar1;
  Vec_Mem_t *pVVar2;
  Gem_Obj_t *pGVar3;
  word **ppwVar4;
  word *pTruth;
  word *pCof0;
  word *pCof1;
  ulong uVar5;
  ulong uVar6;
  word wVar7;
  int w;
  int iVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  word *pwVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  word *pwVar20;
  word *pwVar21;
  ulong uVar22;
  char pCanonPermC [16];
  char local_48 [24];
  
  if ((f < 0) || (pVVar2 = p->vTtMem, pVVar2->nEntries <= f)) {
    __assert_fail("i >= 0 && i < p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
  }
  pGVar3 = p->pObjs;
  uVar12 = *(uint *)(pGVar3 + f) & 0xf;
  if ((int)uVar12 <= i) {
    __assert_fail("i < (int)pObj->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xde,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  iVar8 = p->nVars;
  if (iVar8 < (int)(uVar12 + 2)) {
    __assert_fail("(int)pObj->nVars + 2 <= p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xdf,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  iVar1 = p->nObjs;
  ppwVar4 = p->pTtElems;
  pTruth = ppwVar4[iVar8];
  pCof0 = ppwVar4[(long)iVar8 + 2];
  pCof1 = ppwVar4[(long)iVar8 + 3];
  iVar8 = p->nWords;
  if (0 < (long)iVar8) {
    uVar12 = pVVar2->PageMask;
    iVar9 = pVVar2->nEntrySize;
    pwVar15 = pVVar2->ppPages[(uint)f >> ((byte)pVVar2->LogPageSze & 0x1f)];
    lVar13 = 0;
    do {
      pTruth[lVar13] = pwVar15[(int)((uVar12 & f) * iVar9) + lVar13];
      lVar13 = lVar13 + 1;
    } while (iVar8 != lVar13);
    uVar12 = *(uint *)(pGVar3 + f) & 0xf;
  }
  uVar14 = (ulong)(uVar12 - 1);
  uVar10 = (ulong)(uint)i;
  if (i < (int)(uVar12 - 1)) {
    uVar10 = (ulong)i;
    do {
      uVar12 = p->nWords;
      if ((long)uVar10 < 5) {
        if (0 < (int)uVar12) {
          uVar14 = s_PMasks[uVar10][0];
          uVar18 = s_PMasks[uVar10][1];
          uVar5 = s_PMasks[uVar10][2];
          uVar22 = 0;
          do {
            uVar6 = pTruth[uVar22];
            bVar11 = (byte)(1 << ((byte)uVar10 & 0x1f));
            pTruth[uVar22] =
                 (uVar6 & uVar5) >> (bVar11 & 0x3f) |
                 (uVar6 & uVar18) << (bVar11 & 0x3f) | uVar6 & uVar14;
            uVar22 = uVar22 + 1;
          } while (uVar12 != uVar22);
        }
      }
      else if (uVar10 == 5) {
        pwVar15 = pTruth;
        if (0 < (int)uVar12) {
          do {
            *(ulong *)((long)pwVar15 + 4) =
                 CONCAT44((int)*(undefined8 *)((long)pwVar15 + 4),
                          (int)((ulong)*(undefined8 *)((long)pwVar15 + 4) >> 0x20));
            pwVar15 = pwVar15 + 2;
          } while (pwVar15 < pTruth + (int)uVar12);
        }
      }
      else if (0 < (int)uVar12) {
        uVar16 = 1 << ((byte)uVar10 - 6 & 0x1f);
        if (uVar10 < 7) {
          uVar16 = 1;
        }
        uVar14 = (ulong)uVar16;
        uVar16 = uVar16 * 4;
        pwVar20 = pTruth + uVar14 * 2;
        pwVar15 = pTruth + uVar14;
        pwVar21 = pTruth;
        do {
          uVar18 = 0;
          do {
            wVar7 = pwVar15[uVar18];
            pwVar15[uVar18] = pwVar20[uVar18];
            pwVar20[uVar18] = wVar7;
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
          pwVar21 = pwVar21 + uVar16;
          pwVar20 = pwVar20 + uVar16;
          pwVar15 = pwVar15 + uVar16;
        } while (pwVar21 < pTruth + (int)uVar12);
      }
      uVar10 = uVar10 + 1;
      uVar14 = (ulong)(*(uint *)(pGVar3 + f) & 0xf) - 1;
    } while ((long)uVar10 < (long)uVar14);
  }
  iVar8 = (int)uVar10;
  if (iVar8 != (int)uVar14) {
    __assert_fail("v == (int)pObj->nVars-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xe5,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  iVar9 = p->nWords;
  lVar13 = (long)iVar9;
  bVar11 = (byte)uVar10;
  if (lVar13 == 1) {
    bVar11 = (byte)(1 << (bVar11 & 0x1f));
    *pCof0 = (s_Truths6Neg[iVar8] & *pTruth) << (bVar11 & 0x3f) | s_Truths6Neg[iVar8] & *pTruth;
    *pCof1 = (s_Truths6[iVar8] & *pTruth) >> (bVar11 & 0x3f) | s_Truths6[iVar8] & *pTruth;
  }
  else {
    if (iVar8 < 6) {
      if (iVar9 < 1) goto LAB_0048e350;
      uVar10 = s_Truths6Neg[iVar8];
      lVar17 = 0;
      do {
        pCof0[lVar17] =
             (pTruth[lVar17] & uVar10) << ((byte)(1 << (bVar11 & 0x1f)) & 0x3f) |
             pTruth[lVar17] & uVar10;
        lVar17 = lVar17 + 1;
      } while (lVar13 != lVar17);
    }
    else {
      if (iVar9 < 1) goto LAB_0048e350;
      uVar10 = (ulong)(uint)(1 << (bVar11 - 6 & 0x1f));
      uVar12 = 2 << (bVar11 - 6 & 0x1f);
      pwVar15 = pCof0 + uVar10;
      pwVar21 = pTruth;
      pwVar20 = pCof0;
      do {
        uVar14 = 0;
        do {
          wVar7 = pwVar21[uVar14];
          pwVar20[uVar14] = wVar7;
          pwVar15[uVar14] = wVar7;
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
        pwVar21 = pwVar21 + uVar12;
        pwVar15 = pwVar15 + uVar12;
        pwVar20 = pwVar20 + uVar12;
      } while (pwVar21 < pTruth + lVar13);
    }
    if (iVar8 < 6) {
      if (iVar9 < 1) goto LAB_0048e350;
      uVar10 = s_Truths6[iVar8];
      lVar17 = 0;
      do {
        pCof1[lVar17] =
             (pTruth[lVar17] & uVar10) >> ((byte)(1 << (bVar11 & 0x1f)) & 0x3f) |
             pTruth[lVar17] & uVar10;
        lVar17 = lVar17 + 1;
      } while (lVar13 != lVar17);
    }
    else {
      if (iVar9 < 1) goto LAB_0048e350;
      bVar11 = (byte)(iVar8 + -6);
      uVar12 = 1 << (bVar11 & 0x1f);
      iVar19 = 2 << (bVar11 & 0x1f);
      uVar10 = 1;
      pwVar15 = pCof1;
      pwVar21 = pTruth;
      if (1 < (int)uVar12) {
        uVar10 = (ulong)uVar12;
      }
      do {
        if (iVar8 + -6 != 0x1f) {
          uVar14 = 0;
          do {
            wVar7 = pwVar21[(long)(int)uVar12 + uVar14];
            pwVar15[uVar14] = wVar7;
            pwVar15[(long)(int)uVar12 + uVar14] = wVar7;
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
        }
        pwVar21 = pwVar21 + iVar19;
        pwVar15 = pwVar15 + iVar19;
      } while (pwVar21 < pTruth + lVar13);
    }
    if (iVar9 < 1) goto LAB_0048e350;
  }
  pwVar15 = ppwVar4[iVar8];
  pwVar21 = ppwVar4[(long)iVar8 + 1];
  pwVar20 = ppwVar4[(long)iVar8 + 2];
  lVar17 = 0;
  do {
    pTruth[lVar17] =
         pwVar20[lVar17] & pwVar21[lVar17] | (pwVar20[lVar17] | pwVar21[lVar17]) & pwVar15[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar13 != lVar17);
  lVar17 = 0;
  do {
    pTruth[lVar17] = (pCof1[lVar17] ^ pCof0[lVar17]) & pTruth[lVar17] ^ pCof0[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar13 != lVar17);
LAB_0048e350:
  Abc_TtCanonicizePerm(pTruth,(*(uint *)(pGVar3 + f) & 0xf) + 2,local_48);
  uVar16 = *(uint *)(pGVar3 + f) & 0xf;
  uVar12 = 4;
  if (4 < uVar16) {
    uVar12 = uVar16;
  }
  iVar8 = p->nVars;
  if (uVar12 + 2 != iVar8) {
    if (iVar8 <= (int)(uVar12 + 2)) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar12 = 1 << ((char)uVar12 - 4U & 0x1f);
    if (uVar16 < 5) {
      uVar12 = 1;
    }
    uVar16 = 1 << ((char)iVar8 - 6U & 0x1f);
    if (uVar12 != uVar16) {
      if ((int)uVar16 <= (int)uVar12) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      uVar10 = (ulong)uVar12;
      uVar14 = 0;
      pwVar15 = pTruth;
      do {
        uVar18 = 0;
        do {
          pwVar15[uVar18] = pTruth[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar10 != uVar18);
        uVar14 = uVar14 + uVar10;
        pwVar15 = pwVar15 + uVar10;
      } while (uVar14 < uVar16);
    }
  }
  iVar8 = Vec_MemHashInsert(p->vTtMem,pTruth);
  if (p->nObjs <= iVar8) {
    if (iVar8 != p->nObjs) {
      __assert_fail("iFunc == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xf2,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
    }
    uVar12 = *(uint *)(pGVar3 + iVar1);
    uVar16 = *(int *)(pGVar3 + f) + 2U & 0xf;
    *(uint *)(pGVar3 + iVar1) = uVar12 & 0xfffffff0 | uVar16;
    *(uint *)(pGVar3 + iVar1) = uVar12 & 0xffffff00 | uVar16 | *(int *)(pGVar3 + f) + 0x10U & 0xf0;
    iVar9 = Gem_GroupsDerive(pTruth,uVar16,pCof0,pCof1);
    bVar11 = *(byte *)(pGVar3 + iVar1);
    pGVar3[iVar1].Predec = f;
    *(uint *)(pGVar3 + iVar1) = (i & 0xffU) << 8 | iVar9 << 0x10 | (uint)bVar11;
    Gem_PrintNode(p,iVar8,"Expand  ",0);
    if (p->nObjsAlloc <= p->nObjs) {
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xfa,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
    }
    iVar8 = p->nObjs + 1;
    p->nObjs = iVar8;
    if (iVar8 == p->nObjsAlloc) {
      Gem_ManRealloc(p);
    }
  }
  return;
}

Assistant:

void Gem_FuncExpand( Gem_Man_t * p, int f, int i )
{
    Gem_Obj_t * pNew = p->pObjs + p->nObjs, * pObj = p->pObjs + f; 
    word * pTruth   = Vec_MemReadEntry( p->vTtMem, f );
    word * pResult  = p->pTtElems[p->nVars];
    word * pCofs[2] = { p->pTtElems[p->nVars+2], p->pTtElems[p->nVars+3] };
    int v, iFunc;
    char pCanonPermC[16];
    assert( i < (int)pObj->nVars );
    assert( (int)pObj->nVars + 2 <= p->nVars );
    Abc_TtCopy( pResult, pTruth, p->nWords, 0 );
    // move i variable to the end
    for ( v = i; v < (int)pObj->nVars-1; v++ )
        Abc_TtSwapAdjacent( pResult, p->nWords, v );
    // create new symmetric group
    assert( v == (int)pObj->nVars-1 );
    Abc_TtCofactor0p( pCofs[0], pResult, p->nWords, v );
    Abc_TtCofactor1p( pCofs[1], pResult, p->nWords, v );
    Abc_TtMaj( pResult, p->pTtElems[v], p->pTtElems[v+1], p->pTtElems[v+2], p->nWords );
    Abc_TtMux( pResult, pResult, pCofs[1], pCofs[0], p->nWords );
    // canonicize
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n");
    Abc_TtCanonicizePerm( pResult, pObj->nVars + 2, pCanonPermC );
    Abc_TtStretch6( pResult, Abc_MaxInt(6, pObj->nVars+2), p->nVars );
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n\n");
    iFunc = Vec_MemHashInsert( p->vTtMem, pResult );
    if ( iFunc < p->nObjs )
        return;
    assert( iFunc == p->nObjs );
    pNew->nVars   = pObj->nVars + 2;
    pNew->nNodes  = pObj->nNodes + 1;
    pNew->Groups  = Gem_GroupsDerive( pResult, pNew->nVars, pCofs[0], pCofs[1] );
    pNew->Predec  = f;
    pNew->History = i; 
    Gem_PrintNode( p, iFunc, "Expand  ", 0 );

    assert( p->nObjs < p->nObjsAlloc );
    if ( ++p->nObjs == p->nObjsAlloc )
        Gem_ManRealloc( p );
}